

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

void desc_ego_fake(wchar_t oid)

{
  wchar_t wVar1;
  ego_item *ego_00;
  textblock *tb_00;
  char *pcVar2;
  region_conflict area;
  textblock *tb;
  ego_item *ego;
  wchar_t e_idx;
  wchar_t oid_local;
  
  wVar1 = default_item_id(oid);
  ego_00 = e_info + wVar1;
  tb_00 = object_info_ego(ego_00);
  wVar1 = default_group_id(oid);
  pcVar2 = ego_grp_name(wVar1);
  pcVar2 = format("%s %s",pcVar2,ego_00->name);
  textui_textblock_show(tb_00,(region_conflict)ZEXT816(0),pcVar2);
  textblock_free(tb_00);
  return;
}

Assistant:

static void desc_ego_fake(int oid)
{
	int e_idx = default_item_id(oid);
	struct ego_item *ego = &e_info[e_idx];

	textblock *tb;
	region area = { 0, 0, 0, 0 };

	/* List ego flags */
	tb = object_info_ego(ego);

	textui_textblock_show(tb, area, format("%s %s",
										   ego_grp_name(default_group_id(oid)),
										   ego->name));
	textblock_free(tb);
}